

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
ExtractShaders<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *PSOCreateInfo,
          vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
          *ShaderStages,bool WaitUntilShadersReady)

{
  undefined7 in_register_00000009;
  string msg;
  string local_48;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      ).m_Desc.PipelineType != (PSOCreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
  {
    FormatString<char[26],char[64]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.PipelineType == PSOCreateInfo.PSODesc.PipelineType",
               (char (*) [64])CONCAT71(in_register_00000009,WaitUntilShadersReady));
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3ae);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  PipelineStateUtils::
  ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
            (PSOCreateInfo,ShaderStages,WaitUntilShadersReady,&this->m_ActiveShaderStages);
  return;
}

Assistant:

void ExtractShaders(const PSOCreateInfoType& PSOCreateInfo,
                        TShaderStages&           ShaderStages,
                        bool                     WaitUntilShadersReady = false)
    {
        VERIFY_EXPR(this->m_Desc.PipelineType == PSOCreateInfo.PSODesc.PipelineType);
        PipelineStateUtils::ExtractShaders<ShaderImplType>(PSOCreateInfo, ShaderStages, WaitUntilShadersReady, m_ActiveShaderStages);
    }